

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::removeOrderImpl(PatternModel *this,int at)

{
  int iVar1;
  int count;
  undefined1 local_30 [8];
  Editor editor;
  Order *_order;
  int at_local;
  PatternModel *this_local;
  
  editor.super_QMutexLocker<QMutex>._8_8_ = order(this);
  Module::edit((Module *)local_30);
  iVar1 = trackerboy::Order::size((Order *)editor.super_QMutexLocker<QMutex>._8_8_);
  if (at == iVar1 + -1) {
    aboutToRemoveLastPattern(this);
  }
  trackerboy::Order::remove
            ((Order *)editor.super_QMutexLocker<QMutex>._8_8_,(char *)(ulong)(uint)at);
  Module::Editor::~Editor((Editor *)local_30);
  iVar1 = trackerboy::Order::size((Order *)editor.super_QMutexLocker<QMutex>._8_8_);
  if (this->mCursorPattern < iVar1) {
    invalidate(this,at,true);
  }
  else {
    setCursorPattern(this,iVar1 + -1);
  }
  patternCountChanged(this,iVar1);
  return;
}

Assistant:

void PatternModel::removeOrderImpl(int at) {
    auto &_order = order();
    {
        auto editor = mModule.edit();
        if (at == _order.size() - 1) {
            emit aboutToRemoveLastPattern();
        }
        _order.remove(at);
    }

    auto count = _order.size();
    if (mCursorPattern >= count) {
        setCursorPattern(count - 1);
    } else {
        invalidate(at, true);
    }
    emit patternCountChanged(count);
}